

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::RepeatedPrimitiveFieldGenerator::GenerateSerializationCode
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Type TVar2;
  JavaType type;
  char *text;
  FieldDescriptor *this_00;
  
  io::Printer::Print(printer,&this->variables_,
                     "if (this.$name$ != null && this.$name$.length > 0) {\n");
  io::Printer::Indent(printer);
  this_00 = this->descriptor_;
  if (*(int *)(this_00 + 0x4c) == 3) {
    TVar2 = FieldDescriptor::type(this_00);
    this_00 = this->descriptor_;
    if ((TVar2 - TYPE_UINT32 < 0xfffffffc) &&
       (*(char *)(*(long *)(this_00 + 0x80) + 0x6c) == '\x01')) {
      GenerateRepeatedDataSizeCode(this,printer);
      text = 
      "output.writeRawVarint32($tag$);\noutput.writeRawVarint32(dataSize);\nfor (int i = 0; i < this.$name$.length; i++) {\n  output.write$capitalized_type$NoTag(this.$name$[i]);\n}\n"
      ;
      goto LAB_002ad0e0;
    }
  }
  TVar2 = FieldDescriptor::type(this_00);
  type = GetJavaType(TVar2);
  bVar1 = anon_unknown_5::IsReferenceType(type);
  text = 
  "for (int i = 0; i < this.$name$.length; i++) {\n  output.write$capitalized_type$($number$, this.$name$[i]);\n}\n"
  ;
  if (bVar1) {
    text = 
    "for (int i = 0; i < this.$name$.length; i++) {\n  $type$ element = this.$name$[i];\n  if (element != null) {\n    output.write$capitalized_type$($number$, element);\n  }\n}\n"
    ;
  }
LAB_002ad0e0:
  io::Printer::Print(printer,&this->variables_,text);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (this.$name$ != null && this.$name$.length > 0) {\n");
  printer->Indent();

  if (descriptor_->is_packable() && descriptor_->options().packed()) {
    GenerateRepeatedDataSizeCode(printer);
    printer->Print(variables_,
      "output.writeRawVarint32($tag$);\n"
      "output.writeRawVarint32(dataSize);\n"
      "for (int i = 0; i < this.$name$.length; i++) {\n"
      "  output.write$capitalized_type$NoTag(this.$name$[i]);\n"
      "}\n");
  } else if (IsReferenceType(GetJavaType(descriptor_))) {
    printer->Print(variables_,
      "for (int i = 0; i < this.$name$.length; i++) {\n"
      "  $type$ element = this.$name$[i];\n"
      "  if (element != null) {\n"
      "    output.write$capitalized_type$($number$, element);\n"
      "  }\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "for (int i = 0; i < this.$name$.length; i++) {\n"
      "  output.write$capitalized_type$($number$, this.$name$[i]);\n"
      "}\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}